

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTableFill(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name table)

{
  Name table_00;
  TableFill *pTVar1;
  bool bVar2;
  Ok local_d9;
  IRBuilder *local_d8;
  size_t local_d0;
  uint local_c4;
  Err local_c0;
  Err *local_90;
  Err *err;
  Result<wasm::Ok> _val;
  TableFill curr;
  IRBuilder *this_local;
  Name table_local;
  
  table_local.super_IString.str._M_len = table.super_IString.str._M_str;
  this_local = table.super_IString.str._M_len;
  pTVar1 = (TableFill *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  curr.size = (Expression *)this;
  table_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  TableFill::TableFill(pTVar1);
  wasm::Name::operator=
            ((Name *)&curr.super_SpecificExpression<(wasm::Expression::Id)49>.super_Expression.type,
             (Name *)&this_local);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitTableFill
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pTVar1);
  local_90 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_90 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_c0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c0);
    wasm::Err::~Err(&local_c0);
  }
  local_c4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_c4 == 0) {
    local_d8 = this_local;
    local_d0 = table_local.super_IString.str._M_len;
    table_00.super_IString.str._M_str = (char *)table_local.super_IString.str._M_len;
    table_00.super_IString.str._M_len = (size_t)this_local;
    pTVar1 = Builder::makeTableFill
                       (&this->builder,table_00,(Expression *)curr.table.super_IString.str._M_str,
                        curr.dest,curr.value);
    push(this,(Expression *)pTVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_d9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeTableFill(Name table) {
  TableFill curr;
  curr.table = table;
  CHECK_ERR(visitTableFill(&curr));
  push(builder.makeTableFill(table, curr.dest, curr.value, curr.size));
  return Ok{};
}